

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ex_2.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  MemSegment *pMVar1;
  void *pvVar2;
  MmapArena local_298;
  NoActionMemLogger local_288 [8];
  undefined **local_280;
  MmapArena *local_278;
  NoActionMemLogger *local_270;
  MemPool<cookmem::MmapArena,_cookmem::NoActionMemLogger,_void> local_268;
  
  local_278 = &local_298;
  local_298.m_minSize = 0x10000;
  local_298.m_prot = 3;
  local_298.m_flag = 0x22;
  local_270 = local_288;
  local_280 = &PTR__MemContext_00105da0;
  local_268.m_arena = local_278;
  local_268.m_logger = local_270;
  memset(&local_268.m_footprintLimit,0,0x232);
  local_268.m_paddingByte = -0x33;
  local_280 = &PTR__SimpleMemContext_00105d08;
  pvVar2 = cookmem::MemPool<cookmem::MmapArena,_cookmem::NoActionMemLogger,_void>::allocate
                     (&local_268,100);
  pvVar2 = cookmem::MemPool<cookmem::MmapArena,_cookmem::NoActionMemLogger,_void>::reallocate
                     (&local_268,pvVar2,1000);
  cookmem::MemPool<cookmem::MmapArena,_cookmem::NoActionMemLogger,_void>::deallocate
            (&local_268,pvVar2,0);
  local_280 = &PTR__MemContext_00105da0;
  while (local_268.m_segList != (MemSegment *)0x0) {
    pMVar1 = (local_268.m_segList)->m_next;
    munmap(local_268.m_segList,(local_268.m_segList)->m_size);
    local_268.m_segList = pMVar1;
  }
  return 0;
}

Assistant:

int
main (int argc, const char* argv[])
{
    // Use default arena
    cookmem::SimpleMemContext<cookmem::MmapArena> memCtx;

    // allocate memory
    void* ptr = memCtx.allocate (100);

    // change the size of the memory
    ptr = memCtx.reallocate (ptr, 1000);

    // free the memory
    memCtx.deallocate (ptr);

    return 0;
}